

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O0

void __thiscall cmCTestBZR::UpdateParser::~UpdateParser(UpdateParser *this)

{
  UpdateParser *this_local;
  
  ~UpdateParser(this);
  operator_delete(this,0x278);
  return;
}

Assistant:

UpdateParser(cmCTestBZR* bzr, const char* prefix)
    : BZR(bzr)
  {
    this->SetLog(&bzr->Log, prefix);
    this->RegexUpdate.compile("^([-+R?XCP ])([NDKM ])([* ]) +(.+)$");
  }